

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,Entry *args_1)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  ushort uVar5;
  group_type_pointer pgVar6;
  long lVar7;
  ulong uVar8;
  pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode> *ppVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  
  pgVar6 = __return_storage_ptr__->pg;
  uVar10 = (ulong)__return_storage_ptr__->n;
  ppVar9 = __return_storage_ptr__->p;
  lVar11 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar12[0] = -(pgVar2->m[0].n == '\0');
    auVar12[1] = -(pgVar2->m[1].n == '\0');
    auVar12[2] = -(pgVar2->m[2].n == '\0');
    auVar12[3] = -(pgVar2->m[3].n == '\0');
    auVar12[4] = -(pgVar2->m[4].n == '\0');
    auVar12[5] = -(pgVar2->m[5].n == '\0');
    auVar12[6] = -(pgVar2->m[6].n == '\0');
    auVar12[7] = -(pgVar2->m[7].n == '\0');
    auVar12[8] = -(pgVar2->m[8].n == '\0');
    auVar12[9] = -(pgVar2->m[9].n == '\0');
    auVar12[10] = -(pgVar2->m[10].n == '\0');
    auVar12[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar12[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar12[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar12[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar12[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar10 = (ulong)uVar4;
      ppVar3 = arrays_->elements_;
      uVar8 = (ulong)(uVar4 << 7);
      *(uintptr_t *)((long)&ppVar3[pos0 * 0xf].first.value + uVar8) = args_1->value;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_size_index + uVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .size_ctrl.ml + uVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_size_index + uVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .size_ctrl.ml + uVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.binds.
               super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar8) = (undefined1  [16])0x0;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.binds.
               super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar8) = 0;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_size_index + uVar8) = 0x3f;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_size_mask + uVar8) = 1;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_ + uVar8) = (undefined1  [16])0x0;
      *(undefined1 **)
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .arrays.groups_ + uVar8) =
           &dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
            ::storage;
      lVar7 = *(long *)((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                               .arrays.elements_ + uVar8);
      if (lVar7 != 0) {
        lVar7 = 0x1d;
      }
      *(long *)((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                       .size_ctrl.ml + uVar8) = lVar7;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.paramOverrides.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
               .size_ctrl.size + uVar8) = 0;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_size_index + uVar8) = 0x3f;
      *(undefined8 *)
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_size_mask + uVar8) = 1;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_ + uVar8) = (undefined1  [16])0x0;
      *(undefined1 **)
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_ + uVar8) =
           &dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
            ::storage;
      lVar7 = *(long *)((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                               .arrays.elements_ + uVar8);
      if (lVar7 != 0) {
        lVar7 = 0x1d;
      }
      *(long *)((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                       .size_ctrl.ml + uVar8) = lVar7;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.binds.
               super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + uVar8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])
       ((long)&ppVar3[pos0 * 0xf].second.childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .size_ctrl.size + uVar8) = (undefined1  [16])0x0;
      ppVar9 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                *)((long)&ppVar3[pos0 * 0xf].first.value + uVar8);
      pgVar1->m[uVar10].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar6 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar11 & arrays_->groups_size_mask;
    lVar11 = lVar11 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar10;
  __return_storage_ptr__->p = ppVar9;
  __return_storage_ptr__->pg = pgVar6;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }